

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddTexCoord
          (X3DImporter *this,aiMesh *pMesh,
          list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pTexCoords)

{
  size_type __n;
  aiVector3D *paVar1;
  long lVar2;
  runtime_error *this_00;
  ulong uVar3;
  _List_node_base *p_Var4;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tc_arr_copy;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_68;
  aiVector3t<float> local_50;
  undefined1 local_40 [16];
  
  local_68.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_68.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  __n = (pTexCoords->super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
        _M_impl._M_node._M_size;
  if (__n == pMesh->mNumVertices) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&local_68,__n);
    p_Var4 = (pTexCoords->super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var4 != (_List_node_base *)pTexCoords) {
      do {
        local_50._0_8_ = p_Var4[1]._M_next;
        local_50.z = 0.0;
        if (local_68.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_68.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
          _M_realloc_insert<aiVector3t<float>>
                    ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_68,
                     (iterator)
                     local_68.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_50);
        }
        else {
          (local_68.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish)->z = 0.0;
          *(undefined8 *)
           local_68.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish = local_50._0_8_;
          local_68.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_68.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        p_Var4 = (((_List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                  &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var4 != (_List_node_base *)pTexCoords);
    }
    uVar3 = (ulong)pMesh->mNumVertices;
    paVar1 = (aiVector3D *)operator_new__(uVar3 * 0xc);
    if (uVar3 != 0) {
      memset(paVar1,0,((uVar3 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    }
    pMesh->mTextureCoords[0] = paVar1;
    pMesh->mNumUVComponents[0] = 2;
    if (pMesh->mNumVertices != 0) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        paVar1 = pMesh->mTextureCoords[0];
        *(undefined4 *)((long)&paVar1->z + lVar2) =
             *(undefined4 *)
              ((long)&(local_68.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->z + lVar2);
        *(undefined8 *)((long)&paVar1->x + lVar2) =
             *(undefined8 *)
              ((long)&(local_68.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->x + lVar2);
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0xc;
      } while (uVar3 < pMesh->mNumVertices);
    }
    if (local_68.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_50._0_8_ = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "MeshGeometry_AddTexCoord. Texture coordinates and vertices count must be equal.","");
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  *(undefined ***)this_00 = &PTR__runtime_error_008e3168;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void X3DImporter::MeshGeometry_AddTexCoord(aiMesh& pMesh, const std::list<aiVector2D>& pTexCoords) const
{
    std::vector<aiVector3D> tc_arr_copy;

    if ( pTexCoords.size() != pMesh.mNumVertices )
    {
        throw DeadlyImportError( "MeshGeometry_AddTexCoord. Texture coordinates and vertices count must be equal." );
    }

	// copy list to array because we are need convert aiVector2D to aiVector3D and also get indexed access as a bonus.
	tc_arr_copy.reserve(pTexCoords.size());
    for ( std::list<aiVector2D>::const_iterator it = pTexCoords.begin(); it != pTexCoords.end(); ++it )
    {
        tc_arr_copy.push_back( aiVector3D( ( *it ).x, ( *it ).y, 0 ) );
    }

	// copy texture coordinates to mesh
	pMesh.mTextureCoords[0] = new aiVector3D[pMesh.mNumVertices];
	pMesh.mNumUVComponents[0] = 2;
    for ( size_t i = 0; i < pMesh.mNumVertices; i++ )
    {
        pMesh.mTextureCoords[ 0 ][ i ] = tc_arr_copy[ i ];
    }
}